

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::createBinaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id left,
          Id right,TBasicType typeProxy,bool reduceComparison)

{
  Op OVar1;
  bool bVar2;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  Id IVar6;
  Id right_00;
  pointer ppIVar7;
  Instruction *pIVar8;
  uint uVar9;
  Instruction *pIVar10;
  ulong uVar11;
  ulong uVar12;
  Decoration decoration;
  Op OVar13;
  Instruction *pIVar14;
  Builder *this_00;
  uint __tmp;
  Id resultType;
  bool bVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint local_88;
  Id local_84;
  Id local_80;
  uint local_7c;
  TGlslangToSpvTraverser *local_78;
  Op local_70;
  Id local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  uVar9 = typeProxy - EbtUint8;
  uVar3 = typeProxy - EbtFloat;
  bVar2 = true;
  IVar4 = 0;
  OVar13 = OpVectorTimesMatrix;
  local_84 = right;
  local_80 = left;
  if (0x1df < (int)op) {
    switch(op) {
    case EOpAddAssign:
      goto switchD_0044330f_caseD_19;
    case EOpSubAssign:
      goto switchD_0044330f_caseD_1a;
    case EOpMulAssign:
      goto switchD_0044330f_caseD_1b;
    case EOpVectorTimesMatrixAssign:
      break;
    case EOpVectorTimesScalarAssign:
      goto switchD_0044330f_caseD_2c;
    case EOpMatrixTimesScalarAssign:
      goto switchD_0044330f_caseD_2f;
    case EOpMatrixTimesMatrixAssign:
switchD_00443368_caseD_1e6:
      OVar13 = OpMatrixTimesMatrix;
      break;
    case EOpDivAssign:
      goto switchD_0044330f_caseD_1c;
    case EOpModAssign:
      goto switchD_0044330f_caseD_1d;
    case EOpAndAssign:
      goto switchD_0044330f_caseD_20;
    case EOpInclusiveOrAssign:
      goto switchD_0044330f_caseD_21;
    case EOpExclusiveOrAssign:
      goto switchD_0044330f_caseD_22;
    case EOpLeftShiftAssign:
      goto switchD_0044330f_caseD_1f;
    case EOpRightShiftAssign:
      goto switchD_0044330f_caseD_1e;
    default:
      switch(op) {
      case EOpAbsDifference:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpAbsISubINTEL;
        break;
      case EOpAddSaturate:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpIAddSatINTEL;
        break;
      case EOpSubSaturate:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpISubSatINTEL;
        break;
      case EOpAverage:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpIAverageINTEL;
        break;
      case EOpAverageRounded:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpIAverageRoundedINTEL;
        break;
      case EOpMul32x16:
        OVar13 = ((uVar9 & 0xfffffff9) == 0) + OpIMul32x16INTEL;
        break;
      default:
        if (op != EOpExpectEXT) {
          return 0;
        }
        OVar13 = OpExpectKHR;
      }
    }
    goto switchD_0044330f_caseD_2d;
  }
  switch(op) {
  case EOpAdd:
switchD_0044330f_caseD_19:
    OVar13 = (uVar3 < 3) + OpIAdd;
    break;
  case EOpSub:
switchD_0044330f_caseD_1a:
    OVar13 = (uVar3 < 3) + OpISub;
    break;
  case EOpMul:
switchD_0044330f_caseD_1b:
    OVar13 = (uVar3 < 3) + OpIMul;
    break;
  case EOpDiv:
switchD_0044330f_caseD_1c:
    OVar13 = OpFDiv;
    if (2 < uVar3) {
      OVar13 = OpSDiv - ((uVar9 & 0xfffffff9) == 0);
    }
    break;
  case EOpMod:
switchD_0044330f_caseD_1d:
    bVar15 = (uVar9 & 0xfffffff9) != 0;
    OVar13 = OpFMod;
    if (2 < uVar3) {
      OVar13 = bVar15 + 0x89 + (uint)bVar15;
    }
    break;
  case EOpRightShift:
switchD_0044330f_caseD_1e:
    OVar13 = OpShiftRightArithmetic - ((uVar9 & 0xfffffff9) == 0);
    break;
  case EOpLeftShift:
switchD_0044330f_caseD_1f:
    OVar13 = OpShiftLeftLogical;
    break;
  case EOpAnd:
switchD_0044330f_caseD_20:
    OVar13 = OpBitwiseAnd;
    break;
  case EOpInclusiveOr:
switchD_0044330f_caseD_21:
    OVar13 = OpBitwiseOr;
    break;
  case EOpExclusiveOr:
switchD_0044330f_caseD_22:
    OVar13 = OpBitwiseXor;
    break;
  case EOpEqual:
  case EOpNotEqual:
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
    if ((!reduceComparison) || (1 < op - EOpEqual)) goto LAB_004435c7;
    ppIVar7 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar7[left] == (Instruction *)0x0) {
      pIVar8 = *ppIVar7;
    }
    else {
      pIVar8 = ppIVar7[ppIVar7[left]->typeId];
    }
    OVar13 = pIVar8->opCode;
    if (1 < OVar13 - OpTypeVector) {
      if ((int)OVar13 < 0x1168) {
        if ((OVar13 != OpTypeArray) && (OVar13 != OpTypeStruct)) {
LAB_004435c7:
          IVar4 = (*(code *)(&DAT_00855954 + *(int *)(&DAT_00855954 + (ulong)(op - EOpEqual) * 4)))
                            (&DAT_00855954,
                             &DAT_00855954 + *(int *)(&DAT_00855954 + (ulong)(op - EOpEqual) * 4));
          return IVar4;
        }
      }
      else if ((OVar13 != OpTypeCooperativeMatrixNV) && (OVar13 != OpTypeCooperativeMatrixKHR))
      goto LAB_004435c7;
    }
    this_00 = &this->builder;
    IVar4 = spv::Builder::createCompositeCompare
                      (this_00,decorations->precision,left,right,op == EOpEqual);
    decoration = decorations->nonUniform;
    goto LAB_00443c0c;
  case EOpComma:
    goto switchD_0044330f_caseD_2b;
  case EOpVectorTimesScalar:
switchD_0044330f_caseD_2c:
    if (uVar3 < 3) {
      ppIVar7 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar8 = ppIVar7[left];
      if (pIVar8 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar8->typeId;
      }
      pIVar10 = ppIVar7[right];
      if (ppIVar7[uVar11]->opCode != OpTypeVector) {
        if (pIVar10 == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)pIVar10->typeId;
        }
        if (ppIVar7[uVar11]->opCode != OpTypeVector) {
          if (pIVar8 == (Instruction *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)pIVar8->typeId;
          }
          if (ppIVar7[uVar11]->opCode != OpTypeCooperativeVectorNV) {
            if (pIVar10 == (Instruction *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = (ulong)pIVar10->typeId;
            }
            OVar13 = OpFMul;
            if (ppIVar7[uVar11]->opCode != OpTypeCooperativeVectorNV) break;
          }
        }
      }
      if (pIVar10 == (Instruction *)0x0) {
        pIVar14 = *ppIVar7;
      }
      else {
        pIVar14 = ppIVar7[pIVar10->typeId];
      }
      local_84 = left;
      local_80 = right;
      if ((pIVar14->opCode != OpTypeVector) && (pIVar14->opCode != OpTypeCooperativeVectorNV)) {
        pIVar8 = pIVar10;
        local_84 = right;
        local_80 = left;
      }
      if (pIVar8 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar8->typeId;
      }
      if (2 < ppIVar7[uVar11]->opCode - OpTypeBool) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bba,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      bVar2 = false;
      left = local_80;
      OVar13 = OpVectorTimesScalar;
      right = local_84;
    }
    else {
      ppIVar7 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar8 = ppIVar7[left];
      if (pIVar8 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar8->typeId;
      }
      pIVar10 = ppIVar7[right];
      if (ppIVar7[uVar11]->opCode != OpTypeCooperativeVectorNV) {
        if (pIVar10 == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)pIVar10->typeId;
        }
        OVar13 = OpIMul;
        if (ppIVar7[uVar11]->opCode != OpTypeCooperativeVectorNV) break;
      }
      if (pIVar10 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar10->typeId;
      }
      IVar4 = right;
      if (ppIVar7[uVar11]->opCode == OpTypeCooperativeVectorNV) {
        pIVar10 = pIVar8;
        IVar4 = left;
        local_80 = right;
      }
      left = local_80;
      if (pIVar10 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar10->typeId;
      }
      if (2 < ppIVar7[uVar11]->opCode - OpTypeBool) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bc2,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      if (ppIVar7[local_80] == (Instruction *)0x0) {
        IVar6 = 0;
      }
      else {
        IVar6 = ppIVar7[local_80]->typeId;
      }
      local_78 = this;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(4);
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = IVar4;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      right = spv::Builder::createCompositeConstruct(&this->builder,IVar6,&local_68);
      local_84 = right;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (Id *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this = local_78;
      OVar13 = OpIMul;
    }
    break;
  case EOpVectorTimesMatrix:
    break;
  case EOpMatrixTimesVector:
    OVar13 = OpMatrixTimesVector;
    break;
  case EOpMatrixTimesScalar:
switchD_0044330f_caseD_2f:
    OVar13 = OpMatrixTimesScalar;
    break;
  case EOpLogicalOr:
    OVar13 = OpLogicalOr;
    goto LAB_00443556;
  case EOpLogicalXor:
    OVar13 = OpLogicalNotEqual;
    goto LAB_00443556;
  case EOpLogicalAnd:
    OVar13 = OpLogicalAnd;
    goto LAB_00443556;
  default:
    if (op == EOpMatrixTimesMatrix) goto switchD_00443368_caseD_1e6;
    if (op != EOpOuterProduct) {
      return 0;
    }
    OVar13 = OpOuterProduct;
LAB_00443556:
    bVar2 = false;
  }
switchD_0044330f_caseD_2d:
  uVar11 = (ulong)left;
  ppIVar7 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar8 = ppIVar7[uVar11];
  if (pIVar8 == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)pIVar8->typeId;
  }
  this_00 = &this->builder;
  if (ppIVar7[uVar12]->opCode != OpTypeMatrix) {
    pIVar10 = ppIVar7[right];
    if (pIVar10 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar10->typeId;
    }
    if (ppIVar7[uVar12]->opCode == OpTypeMatrix) goto LAB_00443940;
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    if ((ppIVar7[uVar12]->opCode == OpTypeCooperativeMatrixKHR) ||
       (ppIVar7[uVar12]->opCode == OpTypeCooperativeMatrixNV)) goto LAB_00443940;
    if (pIVar10 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar10->typeId;
    }
    if ((ppIVar7[uVar12]->opCode == OpTypeCooperativeMatrixNV) ||
       (ppIVar7[uVar12]->opCode == OpTypeCooperativeMatrixKHR)) goto LAB_00443940;
    uVar3 = right;
    if (bVar2) {
      spv::Builder::promoteScalar(this_00,decorations->precision,&local_80,&local_84);
      left = local_80;
      uVar3 = local_84;
    }
    goto LAB_00443bbc;
  }
LAB_00443940:
  bVar2 = false;
  switch(OVar13) {
  case OpFDiv:
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    OVar13 = OpFDiv;
    if (ppIVar7[uVar12]->opCode == OpTypeMatrix) {
      if (ppIVar7[right] == (Instruction *)0x0) {
        uVar3 = 0;
        bVar2 = false;
        if (2 < (*ppIVar7)->opCode - OpTypeBool) goto switchD_00443960_caseD_89;
      }
      else {
        uVar3 = ppIVar7[right]->typeId;
        if (2 < ppIVar7[uVar3]->opCode - OpTypeBool) goto LAB_00443a14;
      }
      IVar4 = spv::Builder::makeFpConstant(this_00,uVar3,1.0,false);
      right = spv::Builder::createBinOp(this_00,OpFDiv,uVar3,IVar4,right);
      ppIVar7 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      OVar13 = OpMatrixTimesScalar;
      break;
    }
LAB_00443a14:
    bVar2 = false;
  default:
    goto switchD_00443960_caseD_89;
  case OpMatrixTimesScalar:
    pIVar10 = ppIVar7[right];
    if (pIVar10 == (Instruction *)0x0) {
      pIVar14 = *ppIVar7;
    }
    else {
      pIVar14 = ppIVar7[pIVar10->typeId];
    }
    OVar13 = pIVar14->opCode;
    uVar3 = left;
    uVar9 = right;
    if (((OVar13 != OpTypeMatrix) && (uVar9 = right, OVar13 != OpTypeCooperativeMatrixNV)) &&
       (uVar9 = right, OVar13 != OpTypeCooperativeMatrixKHR)) {
      pIVar8 = pIVar10;
      uVar3 = right;
      uVar9 = left;
    }
    left = uVar9;
    uVar11 = (ulong)left;
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    if (2 < ppIVar7[uVar12]->opCode - OpTypeBool) {
      __assert_fail("builder.isScalar(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cbd,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar13 = OpMatrixTimesScalar;
    bVar2 = true;
    goto LAB_00443b5d;
  case OpVectorTimesMatrix:
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc0,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar7[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar7[right]->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar13 = OpVectorTimesMatrix;
    break;
  case OpMatrixTimesVector:
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc4,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar7[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar7[right]->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc5,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar13 = OpMatrixTimesVector;
    break;
  case OpMatrixTimesMatrix:
    if (pIVar8 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar8->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc8,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar7[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar7[right]->typeId;
    }
    if (ppIVar7[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc9,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar13 = OpMatrixTimesMatrix;
  }
  bVar2 = true;
switchD_00443960_caseD_89:
  uVar3 = right;
LAB_00443b5d:
  pIVar8 = ppIVar7[uVar11];
  if (pIVar8 == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)pIVar8->typeId;
  }
  if ((ppIVar7[uVar12]->opCode != OpTypeCooperativeMatrixKHR) &&
     (ppIVar7[uVar12]->opCode != OpTypeCooperativeMatrixNV)) {
    pIVar10 = ppIVar7[uVar3];
    if (pIVar10 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar10->typeId;
    }
    if (((!bVar2) && (ppIVar7[uVar12]->opCode != OpTypeCooperativeMatrixNV)) &&
       (ppIVar7[uVar12]->opCode != OpTypeCooperativeMatrixKHR)) {
      if ((0xc < OVar13 - OpFAdd) || ((0x1095U >> (OVar13 - OpFAdd & 0x1f) & 1) == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1d08,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                     );
      }
      if (pIVar8 == (Instruction *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pIVar8->typeId;
      }
      local_70 = ppIVar7[uVar12]->opCode;
      if (pIVar10 == (Instruction *)0x0) {
        OVar1 = (*ppIVar7)->opCode;
        uVar9 = 0;
      }
      else {
        uVar9 = pIVar10->typeId;
        OVar1 = ppIVar7[uVar9]->opCode;
      }
      local_78 = this;
      if (local_70 == OpTypeMatrix) {
        IVar4 = 0;
        IVar6 = 0;
        if (pIVar8 != (Instruction *)0x0) {
          IVar6 = pIVar8->typeId;
        }
        local_88 = spv::Builder::getTypeNumColumns(this_00,IVar6);
        pIVar8 = (local_78->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar11];
        if (pIVar8 != (Instruction *)0x0) {
LAB_00443d3c:
          IVar4 = pIVar8->typeId;
        }
      }
      else {
        local_88 = spv::Builder::getTypeNumColumns(this_00,uVar9);
        pIVar8 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar3];
        if (pIVar8 != (Instruction *)0x0) goto LAB_00443d3c;
        IVar4 = 0;
      }
      uVar9 = spv::Builder::getTypeNumRows(this_00,IVar4);
      IVar4 = spv::Builder::getScalarTypeId(this_00,typeId);
      IVar4 = spv::Builder::makeVectorType(this_00,IVar4,uVar9);
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      ppIVar7 = (local_78->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppIVar7[uVar11] == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)ppIVar7[uVar11]->typeId;
      }
      IVar6 = left;
      if (2 < ppIVar7[uVar11]->opCode - OpTypeBool) {
        IVar5 = 0;
        if (ppIVar7[uVar3] == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)ppIVar7[uVar3]->typeId;
        }
        IVar6 = uVar3;
        if (2 < ppIVar7[uVar11]->opCode - OpTypeBool) goto LAB_00443de7;
      }
      IVar5 = spv::Builder::smearScalar(this_00,decorations->precision,IVar6,IVar4);
LAB_00443de7:
      local_7c = 0;
      if (local_88 != 0) {
        do {
          local_48 = (void *)0x0;
          uStack_40 = 0;
          local_38 = 0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,(iterator)0x0,
                     &local_7c);
          IVar6 = IVar5;
          if (local_70 == OpTypeMatrix) {
            IVar6 = spv::Builder::createCompositeExtract
                              (this_00,left,IVar4,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
          }
          right_00 = IVar5;
          if (OVar1 == OpTypeMatrix) {
            right_00 = spv::Builder::createCompositeExtract
                                 (this_00,uVar3,IVar4,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
          }
          IVar6 = spv::Builder::createBinOp(this_00,OVar13,IVar4,IVar6,right_00);
          spv::Builder::addDecoration(this_00,IVar6,decorations->noContraction,-1);
          spv::Builder::addDecoration(this_00,IVar6,decorations->nonUniform,-1);
          if (IVar6 != 0 && decorations->precision != DecorationMax) {
            spv::Builder::addDecoration(this_00,IVar6,decorations->precision,-1);
          }
          local_6c = IVar6;
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_6c);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar6;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_48 != (void *)0x0) {
            operator_delete(local_48,local_38 - (long)local_48);
          }
          local_7c = local_7c + 1;
        } while (local_7c < local_88);
      }
      IVar4 = spv::Builder::createCompositeConstruct(this_00,typeId,&local_68);
      if (IVar4 != 0 && decorations->precision != DecorationMax) {
        spv::Builder::addDecoration(this_00,IVar4,decorations->precision,-1);
      }
      spv::Builder::addDecoration(this_00,IVar4,decorations->nonUniform,-1);
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return IVar4;
      }
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return IVar4;
    }
  }
LAB_00443bbc:
  IVar4 = spv::Builder::createBinOp(this_00,OVar13,typeId,left,uVar3);
  spv::Builder::addDecoration(this_00,IVar4,decorations->noContraction,-1);
  spv::Builder::addDecoration(this_00,IVar4,decorations->nonUniform,-1);
  decoration = decorations->precision;
  if (IVar4 != 0 && decoration != DecorationMax) {
LAB_00443c0c:
    spv::Builder::addDecoration(this_00,IVar4,decoration,-1);
  }
switchD_0044330f_caseD_2b:
  return IVar4;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator op, OpDecorations& decorations,
                                                      spv::Id typeId, spv::Id left, spv::Id right,
                                                      glslang::TBasicType typeProxy, bool reduceComparison)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);
    bool isBool = typeProxy == glslang::EbtBool;

    spv::Op binOp = spv::OpNop;
    bool needMatchingVectors = true;  // for non-matrix ops, would a scalar need to smear to match a vector?
    bool comparison = false;

    switch (op) {
    case glslang::EOpAdd:
    case glslang::EOpAddAssign:
        if (isFloat)
            binOp = spv::OpFAdd;
        else
            binOp = spv::OpIAdd;
        break;
    case glslang::EOpSub:
    case glslang::EOpSubAssign:
        if (isFloat)
            binOp = spv::OpFSub;
        else
            binOp = spv::OpISub;
        break;
    case glslang::EOpMul:
    case glslang::EOpMulAssign:
        if (isFloat)
            binOp = spv::OpFMul;
        else
            binOp = spv::OpIMul;
        break;
    case glslang::EOpVectorTimesScalar:
    case glslang::EOpVectorTimesScalarAssign:
        if (isFloat && (builder.isVector(left) || builder.isVector(right) || builder.isCooperativeVector(left) || builder.isCooperativeVector(right))) {
            if (builder.isVector(right) || builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            needMatchingVectors = false;
            binOp = spv::OpVectorTimesScalar;
        } else if (isFloat) {
            binOp = spv::OpFMul;
        } else if (builder.isCooperativeVector(left) || builder.isCooperativeVector(right)) {
            if (builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            // Construct a cooperative vector from the scalar
            right = builder.createCompositeConstruct(builder.getTypeId(left), { right });
            binOp = spv::OpIMul;
        } else {
            binOp = spv::OpIMul;
        }
        break;
    case glslang::EOpVectorTimesMatrix:
    case glslang::EOpVectorTimesMatrixAssign:
        binOp = spv::OpVectorTimesMatrix;
        break;
    case glslang::EOpMatrixTimesVector:
        binOp = spv::OpMatrixTimesVector;
        break;
    case glslang::EOpMatrixTimesScalar:
    case glslang::EOpMatrixTimesScalarAssign:
        binOp = spv::OpMatrixTimesScalar;
        break;
    case glslang::EOpMatrixTimesMatrix:
    case glslang::EOpMatrixTimesMatrixAssign:
        binOp = spv::OpMatrixTimesMatrix;
        break;
    case glslang::EOpOuterProduct:
        binOp = spv::OpOuterProduct;
        needMatchingVectors = false;
        break;

    case glslang::EOpDiv:
    case glslang::EOpDivAssign:
        if (isFloat)
            binOp = spv::OpFDiv;
        else if (isUnsigned)
            binOp = spv::OpUDiv;
        else
            binOp = spv::OpSDiv;
        break;
    case glslang::EOpMod:
    case glslang::EOpModAssign:
        if (isFloat)
            binOp = spv::OpFMod;
        else if (isUnsigned)
            binOp = spv::OpUMod;
        else
            binOp = spv::OpSMod;
        break;
    case glslang::EOpRightShift:
    case glslang::EOpRightShiftAssign:
        if (isUnsigned)
            binOp = spv::OpShiftRightLogical;
        else
            binOp = spv::OpShiftRightArithmetic;
        break;
    case glslang::EOpLeftShift:
    case glslang::EOpLeftShiftAssign:
        binOp = spv::OpShiftLeftLogical;
        break;
    case glslang::EOpAnd:
    case glslang::EOpAndAssign:
        binOp = spv::OpBitwiseAnd;
        break;
    case glslang::EOpLogicalAnd:
        needMatchingVectors = false;
        binOp = spv::OpLogicalAnd;
        break;
    case glslang::EOpInclusiveOr:
    case glslang::EOpInclusiveOrAssign:
        binOp = spv::OpBitwiseOr;
        break;
    case glslang::EOpLogicalOr:
        needMatchingVectors = false;
        binOp = spv::OpLogicalOr;
        break;
    case glslang::EOpExclusiveOr:
    case glslang::EOpExclusiveOrAssign:
        binOp = spv::OpBitwiseXor;
        break;
    case glslang::EOpLogicalXor:
        needMatchingVectors = false;
        binOp = spv::OpLogicalNotEqual;
        break;

    case glslang::EOpAbsDifference:
        binOp = isUnsigned ? spv::OpAbsUSubINTEL : spv::OpAbsISubINTEL;
        break;

    case glslang::EOpAddSaturate:
        binOp = isUnsigned ? spv::OpUAddSatINTEL : spv::OpIAddSatINTEL;
        break;

    case glslang::EOpSubSaturate:
        binOp = isUnsigned ? spv::OpUSubSatINTEL : spv::OpISubSatINTEL;
        break;

    case glslang::EOpAverage:
        binOp = isUnsigned ? spv::OpUAverageINTEL : spv::OpIAverageINTEL;
        break;

    case glslang::EOpAverageRounded:
        binOp = isUnsigned ? spv::OpUAverageRoundedINTEL : spv::OpIAverageRoundedINTEL;
        break;

    case glslang::EOpMul32x16:
        binOp = isUnsigned ? spv::OpUMul32x16INTEL : spv::OpIMul32x16INTEL;
        break;

    case glslang::EOpExpectEXT:
        binOp = spv::OpExpectKHR;
        break;

    case glslang::EOpLessThan:
    case glslang::EOpGreaterThan:
    case glslang::EOpLessThanEqual:
    case glslang::EOpGreaterThanEqual:
    case glslang::EOpEqual:
    case glslang::EOpNotEqual:
    case glslang::EOpVectorEqual:
    case glslang::EOpVectorNotEqual:
        comparison = true;
        break;
    default:
        break;
    }

    // handle mapped binary operations (should be non-comparison)
    if (binOp != spv::OpNop) {
        assert(comparison == false);
        if (builder.isMatrix(left) || builder.isMatrix(right) ||
            builder.isCooperativeMatrix(left) || builder.isCooperativeMatrix(right))
            return createBinaryMatrixOperation(binOp, decorations, typeId, left, right);

        // No matrix involved; make both operands be the same number of components, if needed
        if (needMatchingVectors)
            builder.promoteScalar(decorations.precision, left, right);

        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    if (! comparison)
        return 0;

    // Handle comparison instructions

    if (reduceComparison && (op == glslang::EOpEqual || op == glslang::EOpNotEqual)
                         && (builder.isVector(left) || builder.isMatrix(left) || builder.isAggregate(left))) {
        spv::Id result = builder.createCompositeCompare(decorations.precision, left, right, op == glslang::EOpEqual);
        decorations.addNonUniform(builder, result);
        return result;
    }

    switch (op) {
    case glslang::EOpLessThan:
        if (isFloat)
            binOp = spv::OpFOrdLessThan;
        else if (isUnsigned)
            binOp = spv::OpULessThan;
        else
            binOp = spv::OpSLessThan;
        break;
    case glslang::EOpGreaterThan:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThan;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThan;
        else
            binOp = spv::OpSGreaterThan;
        break;
    case glslang::EOpLessThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdLessThanEqual;
        else if (isUnsigned)
            binOp = spv::OpULessThanEqual;
        else
            binOp = spv::OpSLessThanEqual;
        break;
    case glslang::EOpGreaterThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThanEqual;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThanEqual;
        else
            binOp = spv::OpSGreaterThanEqual;
        break;
    case glslang::EOpEqual:
    case glslang::EOpVectorEqual:
        if (isFloat)
            binOp = spv::OpFOrdEqual;
        else if (isBool)
            binOp = spv::OpLogicalEqual;
        else
            binOp = spv::OpIEqual;
        break;
    case glslang::EOpNotEqual:
    case glslang::EOpVectorNotEqual:
        if (isFloat)
            binOp = spv::OpFUnordNotEqual;
        else if (isBool)
            binOp = spv::OpLogicalNotEqual;
        else
            binOp = spv::OpINotEqual;
        break;
    default:
        break;
    }

    if (binOp != spv::OpNop) {
        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    return 0;
}